

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateDefaultGlobalTargets
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  AddGlobalTarget_Package(this,targets);
  AddGlobalTarget_PackageSource(this,targets);
  AddGlobalTarget_Test(this,targets);
  AddGlobalTarget_EditCache(this,targets);
  AddGlobalTarget_RebuildCache(this,targets);
  AddGlobalTarget_Install(this,targets);
  return;
}

Assistant:

void cmGlobalGenerator::CreateDefaultGlobalTargets(
  std::vector<GlobalTargetInfo>& targets)
{
  this->AddGlobalTarget_Package(targets);
  this->AddGlobalTarget_PackageSource(targets);
  this->AddGlobalTarget_Test(targets);
  this->AddGlobalTarget_EditCache(targets);
  this->AddGlobalTarget_RebuildCache(targets);
  this->AddGlobalTarget_Install(targets);
}